

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slimc.c
# Opt level: O3

instrStruct * getInstruction(int pos)

{
  instrStruct *piVar1;
  int iVar2;
  
  iVar2 = 0;
  if (0 < pos) {
    iVar2 = pos;
  }
  iVar2 = iVar2 + 1;
  piVar1 = firstInstr;
  do {
    piVar1 = piVar1->next;
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  return piVar1;
}

Assistant:

instrStruct *getInstruction(int pos) {
	variable struct instrStruct *element;
	variable int i;
	i=0;
	element = firstInstr->next;
	while (i < pos) {
		element = element->next;
		i = i + 1;
	}
	return element;
}